

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O0

char * item2str(Item *q,char *cp)

{
  size_t sVar1;
  Item *in_RSI;
  short *in_RDI;
  char *in_stack_ffffffffffffffe8;
  
  if (*in_RDI == 1) {
    sprintf((char *)in_RSI," %s",*(undefined8 *)(*(long *)(in_RDI + 4) + 0x48));
  }
  else if (*in_RDI == 0x102) {
    sprintf((char *)in_RSI,"%s",*(undefined8 *)(in_RDI + 4));
  }
  else if (*in_RDI == 2) {
    item2str(in_RSI,in_stack_ffffffffffffffe8);
  }
  else {
    sprintf((char *)in_RSI," %s",*(undefined8 *)(in_RDI + 4));
  }
  sVar1 = strlen((char *)in_RSI);
  return (char *)((long)&in_RSI->itemtype + sVar1);
}

Assistant:

char* item2str(Item* q, char* cp) {
  if (q->itemtype == SYMBOL) {
    sprintf(cp, " %s", SYM(q)->name);
  } else if (q->itemtype == VERBATIM) {
    sprintf(cp, "%s", STR(q));
  } else if (q->itemtype == ITEM) {
    item2str(ITM(q), cp);
  }else {
    sprintf(cp, " %s", STR(q));
  }
  return cp + strlen(cp);
}